

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O1

Matcher<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&> * __thiscall
testing::PolymorphicMatcher::operator_cast_to_Matcher
          (Matcher<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&>
           *__return_storage_ptr__,PolymorphicMatcher *this)

{
  undefined8 *puVar1;
  undefined4 *puVar2;
  
  puVar1 = (undefined8 *)operator_new(0x20);
  *puVar1 = &PTR__MonomorphicImpl_001e79c0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(puVar1 + 1),
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)this);
  (__return_storage_ptr__->
  super_MatcherBase<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&>).
  super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_001e7a98;
  (__return_storage_ptr__->
  super_MatcherBase<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&>).vtable_ =
       (VTable *)
       internal::MatcherBase<std::vector<unsigned_char,std::allocator<unsigned_char>>const&>::
       GetVTable<testing::internal::MatcherBase<std::vector<unsigned_char,std::allocator<unsigned_char>>const&>::ValuePolicy<testing::MatcherInterface<std::vector<unsigned_char,std::allocator<unsigned_char>>const&>const*,true>>()
       ::kVTable;
  puVar2 = (undefined4 *)operator_new(0x10);
  *puVar2 = 1;
  *(undefined8 **)(puVar2 + 2) = puVar1;
  (__return_storage_ptr__->
  super_MatcherBase<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&>).buffer_.ptr
       = puVar2;
  (__return_storage_ptr__->
  super_MatcherBase<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&>).
  super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_001e7a28;
  return __return_storage_ptr__;
}

Assistant:

operator Matcher<T>() const {
    return Matcher<T>(new MonomorphicImpl<const T&>(impl_));
  }